

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_large(t_heap<xemmai::t_object> *this,size_t a_size)

{
  t_object *p;
  t_object *local_30;
  size_t local_28;
  
  local_28 = a_size;
  local_30 = (t_object *)f_map(a_size);
  local_30->v_count = 1;
  local_30->v_rank = 0x39;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x38))->__data);
  std::
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  ::_M_emplace_unique<xemmai::t_object*&,unsigned_long&>
            ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
              *)(this + 8),&local_30,&local_28);
  *(long *)(this + 0x128) = *(long *)(this + 0x128) + 1;
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x38));
  return local_30;
}

Assistant:

T* t_heap<T>::f_allocate_large(size_t a_size)
{
	auto p = new(f_map(a_size)) T;
	p->v_rank = c_RANKX;
	{
		std::lock_guard lock(v_mutex);
		v_blocks.emplace(p, a_size);
		++v_allocated;
	}
	return p;
}